

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O2

Node<QByteArray,_QNetworkAccessCache::Node_*> * __thiscall
QHashPrivate::Data<QHashPrivate::Node<QByteArray,_QNetworkAccessCache::Node_*>_>::
findNode<QByteArray>
          (Data<QHashPrivate::Node<QByteArray,_QNetworkAccessCache::Node_*>_> *this,QByteArray *key)

{
  byte bVar1;
  Node<QByteArray,_QNetworkAccessCache::Node_*> *pNVar2;
  Bucket BVar3;
  
  BVar3 = findBucket<QByteArray>(this,key);
  bVar1 = (BVar3.span)->offsets[BVar3.index];
  if (bVar1 == 0xff) {
    pNVar2 = (Node<QByteArray,_QNetworkAccessCache::Node_*> *)0x0;
  }
  else {
    pNVar2 = (Node<QByteArray,_QNetworkAccessCache::Node_*> *)((BVar3.span)->entries + bVar1);
  }
  return pNVar2;
}

Assistant:

Node *findNode(const K &key) const noexcept
    {
        auto bucket = findBucket(key);
        if (bucket.isUnused())
            return nullptr;
        return bucket.node();
    }